

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfailure.h
# Opt level: O2

void __thiscall
UnitTests::TestFailure::TestFailure
          (TestFailure *this,string *msg,string *file,int line,string *failure_type,int error_code)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  *(undefined ***)this = &PTR__TestFailure_0011bd50;
  std::__cxx11::string::string((string *)&local_50,(string *)file);
  FormatError(&local_90,&local_50,line,error_code);
  std::operator+(&local_70,&local_90,failure_type);
  std::operator+(&this->m_what,&local_70,msg);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

TestFailure(std::string msg, std::string file, int line, std::string failure_type, int error_code)
            : m_what(FormatError(std::move(file), line, error_code) + std::move(failure_type) + std::move(msg)),
              m_msg(std::move(msg))
        {
        }